

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O3

size_t mdns_query_recv(int sock,void *buffer,size_t capacity,mdns_record_callback_fn callback,
                      void *user_data,uint8_t one_shot)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  void *user_data_00;
  mdns_record_callback_fn callback_00;
  ushort uVar4;
  int iVar5;
  ssize_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  ushort uVar10;
  long lVar11;
  ulong size;
  size_t offset;
  void *local_70;
  mdns_record_callback_fn local_68;
  socklen_t addrlen;
  sockaddr_in6 addr;
  
  addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
  addr.sin6_addr.__in6_u.__u6_addr32[1] = 0;
  addr.sin6_addr.__in6_u.__u6_addr32[2] = 0;
  addr._20_8_ = 0;
  addr.sin6_family = 2;
  addr.sin6_port = 0;
  addr.sin6_flowinfo = 0;
  addrlen = 0x1c;
  sVar6 = recvfrom(sock,buffer,capacity,0,(sockaddr *)&addr,&addrlen);
  if (0 < (int)(uint)sVar6) {
    uVar1 = *(ushort *)((long)buffer + 6);
    uVar2 = *(ushort *)((long)buffer + 8);
    uVar3 = *(ushort *)((long)buffer + 10);
    if (((one_shot == '\0') || ((ushort)(*buffer << 8 | *buffer >> 8) == mdns_transaction_id)) &&
       (uVar4 = *(ushort *)((long)buffer + 4) << 8 | *(ushort *)((long)buffer + 4) >> 8, uVar4 < 2))
    {
      size = (ulong)((uint)sVar6 & 0x7fffffff);
      lVar11 = (long)buffer + 0xc;
      uVar10 = 0;
      local_70 = user_data;
      local_68 = callback;
      do {
        callback_00 = local_68;
        user_data_00 = local_70;
        offset = lVar11 - (long)buffer;
        if (uVar4 <= uVar10) {
          sVar7 = mdns_records_parse((sockaddr *)&addr,buffer,size,&offset,MDNS_ENTRYTYPE_ANSWER,
                                     (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8),local_68,local_70);
          sVar8 = mdns_records_parse((sockaddr *)&addr,buffer,size,&offset,MDNS_ENTRYTYPE_AUTHORITY,
                                     (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8),callback_00,
                                     user_data_00);
          sVar9 = mdns_records_parse((sockaddr *)&addr,buffer,size,&offset,MDNS_ENTRYTYPE_ADDITIONAL
                                     ,(ulong)(ushort)(uVar3 << 8 | uVar3 >> 8),callback_00,
                                     user_data_00);
          return sVar9 + sVar8 + sVar7;
        }
        iVar5 = mdns_string_skip(buffer,size,&offset);
        lVar11 = (long)buffer + offset + 4;
        uVar10 = 1;
      } while (iVar5 != 0);
    }
  }
  return 0;
}

Assistant:

size_t
mdns_query_recv(int sock, void* buffer, size_t capacity,
                mdns_record_callback_fn callback, void* user_data,
                uint8_t one_shot) {
	struct sockaddr_in6 addr;
	struct sockaddr* saddr = (struct sockaddr*)&addr;
	memset(&addr, 0, sizeof(addr));
	saddr->sa_family = AF_INET;
#ifdef __APPLE__
	saddr->sa_len = sizeof(addr);
#endif
	socklen_t addrlen = sizeof(addr);
	int ret = recvfrom(sock, buffer, capacity, 0,
	                   saddr, &addrlen);
	if (ret <= 0)
		return 0;

	size_t data_size = (size_t)ret;
	uint16_t* data = (uint16_t*)buffer;

	uint16_t transaction_id = ntohs(*data++);
	++data;// uint16_t flags = ntohs(*data++);
	uint16_t questions      = ntohs(*data++);
	uint16_t answer_rrs     = ntohs(*data++);
	uint16_t authority_rrs  = ntohs(*data++);
	uint16_t additional_rrs = ntohs(*data++);

	if (one_shot && transaction_id != mdns_transaction_id)// || (flags != 0x8400))
		return 0; //Not a reply to our last question

	if (questions > 1)
		return 0;

	//Skip questions part
	int i;
	for (i = 0; i < questions; ++i) {
		size_t ofs = (size_t)((char*)data - (char*)buffer);
		if (!mdns_string_skip(buffer, data_size, &ofs))
			return 0;
		data = (uint16_t*)((char*)buffer + ofs);
		++data;
		++data;
	}

	size_t records = 0;
	size_t offset = (size_t)((char*)data - (char*)buffer);
	records += mdns_records_parse(saddr, buffer, data_size, &offset,
	                              MDNS_ENTRYTYPE_ANSWER, answer_rrs,
	                              callback, user_data);
	records += mdns_records_parse(saddr, buffer, data_size, &offset,
	                              MDNS_ENTRYTYPE_AUTHORITY, authority_rrs,
	                              callback, user_data);
	records += mdns_records_parse(saddr, buffer, data_size, &offset,
	                              MDNS_ENTRYTYPE_ADDITIONAL, additional_rrs,
	                              callback, user_data);
	return records;
}